

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::FuncCaseBase::FuncCaseBase
          (FuncCaseBase *this,Context *context,string *name,FuncBase *func)

{
  string local_40;
  
  (*func->_vptr_FuncBase[3])(&local_40,func);
  PrecisionCase::PrecisionCase(&this->super_PrecisionCase,context,name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_PrecisionCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PrecisionCase_00a1d7e0;
  return;
}

Assistant:

FuncCaseBase	(const Context&		context,
									 const string&		name,
									 const FuncBase&	func)
						: PrecisionCase	(context, name, func.getRequiredExtension()) {}